

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3GenerateIndexKey
              (Parse *pParse,Index *pIdx,int iDataCur,int regOut,int prefixOnly,int *piPartIdxLabel,
              Index *pPrior,int regPrior)

{
  ushort uVar1;
  Vdbe *p;
  Expr *pExpr;
  int iVar2;
  uint nReg;
  uint addr;
  int *piVar3;
  ulong uVar4;
  long lStack_50;
  
  p = pParse->pVdbe;
  if (piPartIdxLabel != (int *)0x0) {
    pExpr = pIdx->pPartIdxWhere;
    piVar3 = piPartIdxLabel;
    if (pExpr != (Expr *)0x0) {
      iVar2 = pParse->nLabel + -1;
      pParse->nLabel = iVar2;
      *piPartIdxLabel = iVar2;
      piVar3 = &pParse->iSelfTab;
      pParse->iSelfTab = iDataCur + 1;
      sqlite3ExprIfFalseDup(pParse,pExpr,*piPartIdxLabel,regOut);
      pPrior = (Index *)0x0;
    }
    *piVar3 = 0;
  }
  if ((prefixOnly == 0) || ((pIdx->field_0x63 & 8) == 0)) {
    lStack_50 = 0x60;
  }
  else {
    lStack_50 = 0x5e;
  }
  uVar1 = *(ushort *)((long)&pIdx->zName + lStack_50);
  nReg = (uint)uVar1;
  iVar2 = sqlite3GetTempRange(pParse,nReg);
  if (((pPrior == (Index *)0x0) || (iVar2 != regPrior)) || (pPrior->pPartIdxWhere != (Expr *)0x0)) {
    pPrior = (Index *)0x0;
  }
  for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
    if (((pPrior == (Index *)0x0) || (pPrior->aiColumn[uVar4] == -2)) ||
       (pPrior->aiColumn[uVar4] != pIdx->aiColumn[uVar4])) {
      sqlite3ExprCodeLoadIndexColumn(pParse,pIdx,iDataCur,(int)uVar4,iVar2 + (int)uVar4);
      if (((-1 < pIdx->aiColumn[uVar4]) && (0 < p->nOp)) &&
         (addr = p->nOp - 1, p->aOp[addr].opcode == 'W')) {
        sqlite3VdbeChangeToNoop(p,addr);
      }
    }
  }
  if (regOut != 0) {
    sqlite3VdbeAddOp3(p,0x61,iVar2,nReg,regOut);
  }
  sqlite3ReleaseTempRange(pParse,iVar2,nReg);
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3GenerateIndexKey(
  Parse *pParse,       /* Parsing context */
  Index *pIdx,         /* The index for which to generate a key */
  int iDataCur,        /* Cursor number from which to take column data */
  int regOut,          /* Put the new key into this register if not 0 */
  int prefixOnly,      /* Compute only a unique prefix of the key */
  int *piPartIdxLabel, /* OUT: Jump to this label to skip partial index */
  Index *pPrior,       /* Previously generated index key */
  int regPrior         /* Register holding previous generated key */
){
  Vdbe *v = pParse->pVdbe;
  int j;
  int regBase;
  int nCol;

  if( piPartIdxLabel ){
    if( pIdx->pPartIdxWhere ){
      *piPartIdxLabel = sqlite3VdbeMakeLabel(pParse);
      pParse->iSelfTab = iDataCur + 1;
      sqlite3ExprIfFalseDup(pParse, pIdx->pPartIdxWhere, *piPartIdxLabel,
                            SQLITE_JUMPIFNULL);
      pParse->iSelfTab = 0;
      pPrior = 0; /* Ticket a9efb42811fa41ee 2019-11-02;
                  ** pPartIdxWhere may have corrupted regPrior registers */
    }else{
      *piPartIdxLabel = 0;
    }
  }
  nCol = (prefixOnly && pIdx->uniqNotNull) ? pIdx->nKeyCol : pIdx->nColumn;
  regBase = sqlite3GetTempRange(pParse, nCol);
  if( pPrior && (regBase!=regPrior || pPrior->pPartIdxWhere) ) pPrior = 0;
  for(j=0; j<nCol; j++){
    if( pPrior
     && pPrior->aiColumn[j]==pIdx->aiColumn[j]
     && pPrior->aiColumn[j]!=XN_EXPR
    ){
      /* This column was already computed by the previous index */
      continue;
    }
    sqlite3ExprCodeLoadIndexColumn(pParse, pIdx, iDataCur, j, regBase+j);
    if( pIdx->aiColumn[j]>=0 ){
      /* If the column affinity is REAL but the number is an integer, then it
      ** might be stored in the table as an integer (using a compact
      ** representation) then converted to REAL by an OP_RealAffinity opcode.
      ** But we are getting ready to store this value back into an index, where
      ** it should be converted by to INTEGER again.  So omit the
      ** OP_RealAffinity opcode if it is present */
      sqlite3VdbeDeletePriorOpcode(v, OP_RealAffinity);
    }
  }
  if( regOut ){
    sqlite3VdbeAddOp3(v, OP_MakeRecord, regBase, nCol, regOut);
  }
  sqlite3ReleaseTempRange(pParse, regBase, nCol);
  return regBase;
}